

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmitterBeam::~EmitterBeam(EmitterBeam *this)

{
  EmitterBeam *this_local;
  
  ~EmitterBeam(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

EmitterBeam::~EmitterBeam()
{
    m_vTrackJamTargets.clear();
}